

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderCharacters(void *ctx,xmlChar *ch,int len)

{
  long lVar1;
  xmlTextReaderPtr reader;
  xmlParserCtxtPtr ctxt;
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x58) != 0)) {
    (**(code **)(lVar1 + 0x58))(ctx,ch,len);
  }
  return;
}

Assistant:

static void
xmlTextReaderCharacters(void *ctx, const xmlChar *ch, int len)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlTextReaderPtr reader = ctxt->_private;

#ifdef DEBUG_CALLBACKS
    printf("xmlTextReaderCharacters()\n");
#endif
    if ((reader != NULL) && (reader->characters != NULL)) {
	reader->characters(ctx, ch, len);
    }
}